

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *r,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             *cStatus,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *rStatus,bool isOptimal)

{
  uint *puVar1;
  char cVar2;
  int iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  pointer pnVar6;
  undefined8 uVar7;
  VarStatus *pVVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  bool bVar10;
  int iVar11;
  VarStatus VVar12;
  long lVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aik;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_338;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2f8;
  undefined8 uStack_2f0;
  cpp_dec_float<50U,_int,_void> local_2e8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_2a0;
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  undefined8 local_278;
  uint local_268 [2];
  uint auStack_260 [2];
  uint local_258 [2];
  undefined8 uStack_250;
  undefined8 local_248;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_200;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_190;
  cpp_dec_float<50U,_int,_void> local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  VVar12 = cStatus->data[this->m_k];
  if (VVar12 == ON_UPPER) {
    cVar2 = this->m_strictUp;
joined_r0x0032efee:
    if (cVar2 == '\0') {
      return;
    }
  }
  else {
    if (VVar12 != FIXED) {
      if (VVar12 != ON_LOWER) {
        return;
      }
      cVar2 = this->m_strictLo;
      goto joined_r0x0032efee;
    }
    if (this->m_maxSense == true) {
      iVar11 = this->m_j;
      pnVar6 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar6[iVar11].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_0032f48a:
        iVar11 = this->m_j;
        pnVar6 = (r->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar6[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_338,0,(type *)0x0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar6[iVar11].m_backend,&local_338);
          if ((iVar11 < 0) && (this->m_strictLo != false)) goto LAB_0032eff4;
        }
        goto LAB_0032f4d5;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar6[iVar11].m_backend,&local_338);
      if ((iVar11 < 1) || (this->m_strictUp == false)) goto LAB_0032f48a;
    }
    else {
LAB_0032f4d5:
      if (this->m_maxSense != false) {
        return;
      }
      iVar11 = this->m_j;
      pnVar6 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar6[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_338,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar6[iVar11].m_backend,&local_338);
        if ((0 < iVar11) && (this->m_strictLo != false)) goto LAB_0032eff4;
      }
      iVar11 = this->m_j;
      pnVar6 = (r->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pnVar6[iVar11].m_backend.fpclass == cpp_dec_float_NaN) {
        return;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_338,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar6[iVar11].m_backend,&local_338);
      if (-1 < iVar11) {
        return;
      }
      if (this->m_strictUp != true) {
        return;
      }
    }
  }
LAB_0032eff4:
  local_2e8.data._M_elems._32_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 8);
  local_2e8.data._M_elems._0_8_ = *(undefined8 *)(this->m_kObj).m_backend.data._M_elems;
  local_2e8.data._M_elems._8_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 2);
  local_2e8.data._M_elems._16_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 4);
  local_2e8.data._M_elems._24_8_ = *(undefined8 *)((this->m_kObj).m_backend.data._M_elems + 6);
  local_2e8.exp = (this->m_kObj).m_backend.exp;
  local_2e8.neg = (this->m_kObj).m_backend.neg;
  local_2e8.fpclass = (this->m_kObj).m_backend.fpclass;
  local_2e8.prec_elem = (this->m_kObj).m_backend.prec_elem;
  local_2f8 = r;
  local_2a8 = x;
  local_2a0 = cStatus;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_190,
               &(this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_i);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar15 = 0;
    lVar13 = 0;
    do {
      pNVar4 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar4->val + 1) + lVar15) != this->m_i) {
        pcVar16 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar4->val).m_backend.data._M_elems + lVar15);
        pcVar14 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar4->val + 1) + lVar15)].m_backend;
        local_338.fpclass = cpp_dec_float_finite;
        local_338.prec_elem = 10;
        local_338.data._M_elems[0] = 0;
        local_338.data._M_elems[1] = 0;
        local_338.data._M_elems[2] = 0;
        local_338.data._M_elems[3] = 0;
        local_338.data._M_elems[4] = 0;
        local_338.data._M_elems[5] = 0;
        local_338.data._M_elems._24_5_ = 0;
        local_338.data._M_elems[7]._1_3_ = 0;
        local_338.data._M_elems._32_5_ = 0;
        local_338.data._M_elems[9]._1_3_ = 0;
        local_338.exp = 0;
        local_338.neg = false;
        v = pcVar16;
        if ((&local_338 != pcVar14) && (v = pcVar14, pcVar16 != &local_338)) {
          uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
          local_338.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_338.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_338.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
          local_338.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
          local_338.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
          uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
          local_338.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_338.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_338.exp = *(int *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar15);
          local_338.neg = *(bool *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar15 + 4);
          local_338._48_8_ = *(undefined8 *)((long)(&(pNVar4->val).m_backend.data + 1) + lVar15 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_338,v);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_2e8,&local_338);
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x3c;
    } while (lVar13 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 10;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems._24_5_ = 0;
  local_338.data._M_elems[7]._1_3_ = 0;
  local_338.data._M_elems._32_5_ = 0;
  local_338.data._M_elems[9]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_338,&local_2e8,&local_190);
  pVVar9 = local_2f8;
  iVar11 = this->m_i;
  pnVar6 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar6[iVar11].m_backend.data._M_elems + 8) =
       CONCAT35(local_338.data._M_elems[9]._1_3_,local_338.data._M_elems._32_5_);
  puVar1 = pnVar6[iVar11].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_338.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_338.data._M_elems[7]._1_3_,local_338.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar6[iVar11].m_backend.data = local_338.data._M_elems._0_8_;
  *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 2) = local_338.data._M_elems._8_8_;
  pnVar6[iVar11].m_backend.exp = local_338.exp;
  pnVar6[iVar11].m_backend.neg = local_338.neg;
  pnVar6[iVar11].m_backend.fpclass = local_338.fpclass;
  pnVar6[iVar11].m_backend.prec_elem = local_338.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_2f8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k),0.0);
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 10;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems._24_5_ = 0;
  local_238.data._M_elems[7]._1_3_ = 0;
  local_238.data._M_elems._32_5_ = 0;
  local_238.data._M_elems[9]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  pcVar16 = &local_2e8;
  if (&local_238 != &(this->m_aij).m_backend) {
    local_238.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
    local_238.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
    local_238.data._M_elems[4] = local_2e8.data._M_elems[4];
    local_238.data._M_elems[5] = local_2e8.data._M_elems[5];
    local_238.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
    local_238.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
    local_238.data._M_elems[0] = local_2e8.data._M_elems[0];
    local_238.data._M_elems[1] = local_2e8.data._M_elems[1];
    local_238.data._M_elems[2] = local_2e8.data._M_elems[2];
    local_238.data._M_elems[3] = local_2e8.data._M_elems[3];
    local_238.exp = local_2e8.exp;
    local_238.neg = local_2e8.neg;
    local_238.fpclass = local_2e8.fpclass;
    local_238.prec_elem = local_2e8.prec_elem;
    pcVar16 = &(this->m_aij).m_backend;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_238,pcVar16);
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems._24_5_ = 0;
  local_158.data._M_elems[7]._1_3_ = 0;
  local_158.data._M_elems._32_5_ = 0;
  local_158._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_158,&local_238,&local_190);
  local_338.fpclass = cpp_dec_float_finite;
  local_338.prec_elem = 10;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems._24_5_ = 0;
  local_338.data._M_elems[7]._1_3_ = 0;
  local_338.data._M_elems._32_5_ = 0;
  local_338.data._M_elems[9]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  if (&local_338 != &(this->m_jObj).m_backend) {
    uVar5 = *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 8);
    local_338.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_338.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_338.data._M_elems._0_8_ = *(undefined8 *)(this->m_jObj).m_backend.data._M_elems;
    local_338.data._M_elems._8_8_ = *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 2);
    local_338.data._M_elems._16_8_ = *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 4);
    uVar5 = *(undefined8 *)((this->m_jObj).m_backend.data._M_elems + 6);
    local_338.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_338.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_338.exp = (this->m_jObj).m_backend.exp;
    local_338.neg = (this->m_jObj).m_backend.neg;
    local_338.fpclass = (this->m_jObj).m_backend.fpclass;
    local_338.prec_elem = (this->m_jObj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_338,&local_158);
  iVar11 = this->m_j;
  pnVar6 = (pVVar9->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar6[iVar11].m_backend.data._M_elems + 8) =
       CONCAT35(local_338.data._M_elems[9]._1_3_,local_338.data._M_elems._32_5_);
  puVar1 = pnVar6[iVar11].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_338.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_338.data._M_elems[7]._1_3_,local_338.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar6[iVar11].m_backend.data = local_338.data._M_elems._0_8_;
  *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 2) = local_338.data._M_elems._8_8_;
  pnVar6[iVar11].m_backend.exp = local_338.exp;
  pnVar6[iVar11].m_backend.neg = local_338.neg;
  pnVar6[iVar11].m_backend.fpclass = local_338.fpclass;
  pnVar6[iVar11].m_backend.prec_elem = local_338.prec_elem;
  VVar12 = FIXED;
  if (this->m_jFixed == false) {
    iVar11 = this->m_j;
    pnVar6 = (pVVar9->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_248 = *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 8);
    local_268 = pnVar6[iVar11].m_backend.data._M_elems[0];
    auStack_260 = *(uint (*) [2])(pnVar6[iVar11].m_backend.data._M_elems + 2);
    puVar1 = pnVar6[iVar11].m_backend.data._M_elems + 4;
    local_258 = *(uint (*) [2])puVar1;
    uStack_250 = *(undefined8 *)(puVar1 + 2);
    iVar3 = pnVar6[iVar11].m_backend.exp;
    bVar10 = pnVar6[iVar11].m_backend.neg;
    uVar5._0_4_ = pnVar6[iVar11].m_backend.fpclass;
    uVar5._4_4_ = pnVar6[iVar11].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_68,0,(type *)0x0);
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1c8,this);
    local_338.data._M_elems[0] = local_268[0];
    local_338.data._M_elems[1] = local_268[1];
    local_338.data._M_elems[2] = auStack_260[0];
    local_338.data._M_elems[3] = auStack_260[1];
    local_338.data._M_elems[4] = local_258[0];
    local_338.data._M_elems[5] = local_258[1];
    local_338.data._M_elems._24_5_ = SUB85(uStack_250,0);
    local_338.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_250 >> 0x28);
    local_338.data._M_elems._32_5_ = SUB85(local_248,0);
    local_338.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_248 >> 0x28);
    local_338.exp = iVar3;
    local_338.neg = bVar10;
    local_338._48_8_ = uVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_338,&local_68)
    ;
    if ((local_338.fpclass != cpp_dec_float_NaN) && (local_1c8.fpclass != cpp_dec_float_NaN)) {
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_338,&local_1c8);
      VVar12 = ON_LOWER;
      if (0 < iVar11) goto LAB_0032f732;
    }
    iVar11 = this->m_j;
    pnVar6 = (local_2f8->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_278 = *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 8);
    local_298 = pnVar6[iVar11].m_backend.data._M_elems[0];
    auStack_290 = *(uint (*) [2])(pnVar6[iVar11].m_backend.data._M_elems + 2);
    puVar1 = pnVar6[iVar11].m_backend.data._M_elems + 4;
    local_288 = *puVar1;
    uStack_284 = puVar1[1];
    uStack_280 = puVar1[2];
    uStack_27c = puVar1[3];
    iVar3 = pnVar6[iVar11].m_backend.exp;
    bVar10 = pnVar6[iVar11].m_backend.neg;
    uVar7._0_4_ = pnVar6[iVar11].m_backend.fpclass;
    uVar7._4_4_ = pnVar6[iVar11].m_backend.prec_elem;
    uStack_2f0 = 0;
    local_2f8 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)uVar7;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_200,this);
    local_338.data._M_elems._32_5_ = SUB85(local_278,0);
    local_338.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_278 >> 0x28);
    local_338.data._M_elems[5] = uStack_284;
    local_338.data._M_elems[4] = local_288;
    local_338.data._M_elems._24_5_ = SUB85(CONCAT44(uStack_27c,uStack_280),0);
    local_338.data._M_elems[7]._1_3_ = (undefined3)(uStack_27c >> 8);
    local_338.data._M_elems[0] = local_298[0];
    local_338.data._M_elems[1] = local_298[1];
    uVar5 = local_338.data._M_elems._0_8_;
    local_338.data._M_elems[2] = auStack_290[0];
    local_338.data._M_elems[3] = auStack_290[1];
    local_338.neg = bVar10;
    if ((bVar10 == true) &&
       (local_338.data._M_elems[0] = local_298[0],
       local_338.data._M_elems[0] != 0 || (fpclass_type)local_2f8 != cpp_dec_float_finite)) {
      local_338.neg = false;
    }
    if ((((fpclass_type)local_2f8 != cpp_dec_float_NaN) && (local_200.fpclass != cpp_dec_float_NaN))
       && (local_338.data._M_elems._0_8_ = uVar5, local_338.exp = iVar3, local_338._48_8_ = uVar7,
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_338,&local_200), iVar11 < 1)) {
      iVar11 = this->m_j;
      pnVar6 = (local_2a8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 8);
      local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[iVar11].m_backend.data;
      local_d8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar6[iVar11].m_backend.data._M_elems + 2);
      puVar1 = pnVar6[iVar11].m_backend.data._M_elems + 4;
      local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.m_backend.exp = pnVar6[iVar11].m_backend.exp;
      local_d8.m_backend.neg = pnVar6[iVar11].m_backend.neg;
      local_d8.m_backend.fpclass = pnVar6[iVar11].m_backend.fpclass;
      local_d8.m_backend.prec_elem = pnVar6[iVar11].m_backend.prec_elem;
      local_118.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(this->m_Lo_j).m_backend.data._M_elems;
      local_118.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 2);
      local_118.m_backend.data._M_elems[4] = (this->m_Lo_j).m_backend.data._M_elems[4];
      local_118.m_backend.data._M_elems[5] = (this->m_Lo_j).m_backend.data._M_elems[5];
      local_118.m_backend.data._M_elems[6] = (this->m_Lo_j).m_backend.data._M_elems[6];
      local_118.m_backend.data._M_elems[7] = (this->m_Lo_j).m_backend.data._M_elems[7];
      local_118.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_Lo_j).m_backend.data._M_elems + 8);
      local_118.m_backend.exp = (this->m_Lo_j).m_backend.exp;
      local_118.m_backend.neg = (this->m_Lo_j).m_backend.neg;
      local_118.m_backend.fpclass = (this->m_Lo_j).m_backend.fpclass;
      local_118.m_backend.prec_elem = (this->m_Lo_j).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
      bVar10 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_d8,&local_118,&local_a0);
      VVar12 = ON_LOWER;
      if (bVar10) goto LAB_0032f732;
    }
    VVar12 = ON_UPPER;
  }
LAB_0032f732:
  pVVar8 = local_2a0->data;
  pVVar8[this->m_j] = VVar12;
  pVVar8[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}